

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ColourImpl *pCVar3;
  ulong uVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong *puVar7;
  ulong uVar8;
  size_t skippedRatio;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  ColourGuard local_90;
  ColourImpl local_80;
  ulong local_70 [4];
  ColourGuard local_50;
  ColourGuard local_40;
  
  uVar1 = (totals->testCases).passed;
  uVar8 = (totals->testCases).failed + uVar1 + (totals->testCases).failedButOk +
          (totals->testCases).skipped;
  if (uVar8 == 0) {
    pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if (pCVar3 != (ColourImpl *)0x0) {
      poVar6 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      local_90.m_code = BrightYellow;
      local_90._12_4_ = local_90._12_4_ & 0xffffff00;
      local_90.m_colourImpl = pCVar3;
      ColourImpl::ColourGuard::engageImpl(&local_90,poVar6);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,'O');
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_b0,local_a8);
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if (local_90.m_engaged == true) {
        (*(local_90.m_colourImpl)->_vptr_ColourImpl[2])(local_90.m_colourImpl,0);
      }
LAB_001631f2:
      local_b0 = (long *)CONCAT71(local_b0._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,(char *)&local_b0,1
                );
      return;
    }
  }
  else {
    uVar2 = (totals->testCases).failed;
    uVar5 = uVar2 * 0x50;
    uVar4 = uVar5 / uVar8;
    local_70[3] = uVar4;
    if (uVar5 < uVar8) {
      local_70[3] = 1;
    }
    if (uVar2 == 0) {
      local_70[3] = uVar4;
    }
    uVar2 = (totals->testCases).failedButOk;
    uVar5 = uVar2 * 0x50;
    uVar4 = uVar5 / uVar8;
    local_70[2] = uVar4;
    if (uVar5 < uVar8) {
      local_70[2] = 1;
    }
    if (uVar2 == 0) {
      local_70[2] = uVar4;
    }
    uVar5 = (uVar1 * 0x50) / uVar8;
    local_70[1] = uVar5;
    if (uVar1 * 0x50 < uVar8) {
      local_70[1] = 1;
    }
    if (uVar1 == 0) {
      local_70[1] = uVar5;
    }
    uVar1 = (totals->testCases).skipped;
    uVar5 = uVar1 * 0x50;
    uVar4 = uVar5 / uVar8;
    local_70[0] = 1;
    if (uVar8 <= uVar5) {
      local_70[0] = uVar4;
    }
    if (uVar1 == 0) {
      local_70[0] = uVar4;
    }
    if (local_70[1] + local_70[0] + local_70[2] + local_70[3] < 0x4f) {
      do {
        if ((((local_70[3] <= local_70[2]) || (local_70[3] <= local_70[1])) ||
            (puVar7 = local_70 + 3, local_70[3] <= local_70[0])) &&
           (((local_70[2] <= local_70[1] || (puVar7 = local_70 + 2, local_70[2] <= local_70[0])) &&
            (puVar7 = local_70 + 1, local_70[1] <= local_70[0])))) {
          puVar7 = local_70;
        }
        *puVar7 = *puVar7 + 1;
      } while (local_70[1] + local_70[0] + local_70[2] + local_70[3] < 0x4f);
    }
    if (0x4f < local_70[2] + local_70[3] + local_70[1]) {
      do {
        puVar7 = local_70 + 3;
        if ((((local_70[3] <= local_70[1] || local_70[3] <= local_70[2]) ||
              local_70[3] <= local_70[0]) &&
            (puVar7 = local_70 + 2, local_70[2] <= local_70[1] || local_70[2] <= local_70[0])) &&
           (puVar7 = local_70 + 1, local_70[1] <= local_70[0])) {
          puVar7 = local_70;
        }
        *puVar7 = *puVar7 - 1;
      } while (0x4f < local_70[2] + local_70[3] + local_70[1]);
    }
    uVar4 = local_70[3];
    uVar5 = local_70[2];
    uVar8 = local_70[1];
    pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if (pCVar3 != (ColourImpl *)0x0) {
      poVar6 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      local_40.m_code = BrightRed;
      local_40.m_engaged = false;
      local_40.m_colourImpl = pCVar3;
      ColourImpl::ColourGuard::engageImpl(&local_40,poVar6);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_b0,local_a8);
      pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
      if (pCVar3 != (ColourImpl *)0x0) {
        local_50.m_code = BrightYellow;
        local_50.m_engaged = false;
        local_50.m_colourImpl = pCVar3;
        ColourImpl::ColourGuard::engageImpl(&local_50,poVar6);
        local_90.m_colourImpl = &local_80;
        std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)local_90.m_colourImpl,CONCAT44(local_90._12_4_,local_90.m_code));
        if (local_90.m_colourImpl != &local_80) {
          operator_delete(local_90.m_colourImpl,(long)local_80._vptr_ColourImpl + 1);
        }
        if (local_50.m_engaged == true) {
          (*(local_50.m_colourImpl)->_vptr_ColourImpl[2])(local_50.m_colourImpl,0);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
        if (local_40.m_engaged == true) {
          (*(local_40.m_colourImpl)->_vptr_ColourImpl[2])(local_40.m_colourImpl,0);
        }
        poVar6 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
        if ((((totals->testCases).failed == 0) && ((totals->testCases).failedButOk == 0)) &&
           ((totals->testCases).skipped == 0)) {
          pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
          if (pCVar3 == (ColourImpl *)0x0) goto LAB_0016321a;
          local_90.m_code = BrightGreen;
          local_90._12_4_ = (uint)(uint3)local_90._13_3_ << 8;
          local_90.m_colourImpl = pCVar3;
          ColourImpl::ColourGuard::engageImpl(&local_90,poVar6);
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_b0,local_a8);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if (local_90.m_engaged == true) {
            (*(local_90.m_colourImpl)->_vptr_ColourImpl[2])(local_90.m_colourImpl,0);
          }
        }
        else {
          pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
          if (pCVar3 == (ColourImpl *)0x0) goto LAB_0016321a;
          local_90.m_code = Green;
          local_90._12_4_ = (uint)(uint3)local_90._13_3_ << 8;
          local_90.m_colourImpl = pCVar3;
          ColourImpl::ColourGuard::engageImpl(&local_90,poVar6);
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_b0,local_a8);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if (local_90.m_engaged == true) {
            (*(local_90.m_colourImpl)->_vptr_ColourImpl[2])(local_90.m_colourImpl,0);
          }
        }
        pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
        if (pCVar3 != (ColourImpl *)0x0) {
          poVar6 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
          local_90.m_code = FileName;
          local_90._12_4_ = local_90._12_4_ & 0xffffff00;
          local_90.m_colourImpl = pCVar3;
          ColourImpl::ColourGuard::engageImpl(&local_90,poVar6);
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct((ulong)&local_b0,(char)local_70[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_b0,local_a8);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if (local_90.m_engaged == true) {
            (*(local_90.m_colourImpl)->_vptr_ColourImpl[2])(local_90.m_colourImpl,0);
          }
          goto LAB_001631f2;
        }
      }
    }
  }
LAB_0016321a:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]"
               );
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        std::size_t skippedRatio = makeRatio(totals.testCases.skipped, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio + skippedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)--;

        m_stream << m_colour->guardColour( Colour::Error )
                 << std::string( failedRatio, '=' )
                 << m_colour->guardColour( Colour::ResultExpectedFailure )
                 << std::string( failedButOkRatio, '=' );
        if ( totals.testCases.allPassed() ) {
            m_stream << m_colour->guardColour( Colour::ResultSuccess )
                     << std::string( passedRatio, '=' );
        } else {
            m_stream << m_colour->guardColour( Colour::Success )
                     << std::string( passedRatio, '=' );
        }
        m_stream << m_colour->guardColour( Colour::Skip )
                 << std::string( skippedRatio, '=' );
    } else {
        m_stream << m_colour->guardColour( Colour::Warning )
                 << std::string( CATCH_CONFIG_CONSOLE_WIDTH - 1, '=' );
    }
    m_stream << '\n';
}